

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O2

void mqc_renormd(opj_mqc_t *mqc)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  
  uVar3 = mqc->ct;
  do {
    if (uVar3 == 0) {
      mqc_bytein(mqc);
      uVar3 = mqc->ct;
    }
    uVar1 = mqc->c;
    uVar2 = mqc->a;
    mqc->c = uVar1 * 2;
    mqc->a = uVar2 * 2;
    uVar3 = uVar3 - 1;
    mqc->ct = uVar3;
  } while ((uint)(uVar2 * 2) < 0x8000);
  return;
}

Assistant:

static INLINE void mqc_renormd(opj_mqc_t *const mqc) {
	do {
		if (mqc->ct == 0) {
			mqc_bytein(mqc);
		}
		mqc->a <<= 1;
		mqc->c <<= 1;
		mqc->ct--;
	} while (mqc->a < 0x8000);
}